

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

Node * __thiscall
google::protobuf::Map<unsigned_long,_proto2_unittest::TestIntIntMap>::CloneFromOther
          (Map<unsigned_long,_proto2_unittest::TestIntIntMap> *this,
          Map<unsigned_long,_proto2_unittest::TestIntIntMap> *other)

{
  bool bVar1;
  reference __in;
  type *args;
  type *from;
  Map<unsigned_long,_proto2_unittest::TestIntIntMap> *pMVar2;
  Node *new_node;
  type *value;
  type *key;
  undefined1 local_70 [8];
  const_iterator __end0;
  const_iterator __begin0;
  Map<unsigned_long,_proto2_unittest::TestIntIntMap> *__range3;
  Node *head;
  Map<unsigned_long,_proto2_unittest::TestIntIntMap> *other_local;
  Map<unsigned_long,_proto2_unittest::TestIntIntMap> *this_local;
  Node *node;
  
  __range3 = (Map<unsigned_long,_proto2_unittest::TestIntIntMap> *)0x0;
  begin((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,other);
  end((const_iterator *)local_70,other);
  while( true ) {
    bVar1 = protobuf::operator!=
                      ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_,
                       (const_iterator *)local_70);
    if (!bVar1) break;
    __in = const_iterator::operator*
                     ((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    args = std::get<0ul,unsigned_long_const,proto2_unittest::TestIntIntMap>(__in);
    from = std::get<1ul,unsigned_long_const,proto2_unittest::TestIntIntMap>(__in);
    pMVar2 = (Map<unsigned_long,_proto2_unittest::TestIntIntMap> *)
             internal::UntypedMapBase::AllocNode((UntypedMapBase *)this,0x58);
    bVar1 = internal::InitializeMapKey<unsigned_long,unsigned_long_const&>
                      ((unsigned_long *)
                       &(pMVar2->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.
                        index_of_first_non_null_,args,
                       (this->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.arena_);
    if (!bVar1) {
      Arena::CreateInArenaStorage<unsigned_long,unsigned_long_const&>
                ((unsigned_long *)
                 &(pMVar2->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.
                  index_of_first_non_null_,
                 (this->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.arena_,args);
    }
    Arena::CreateInArenaStorage<proto2_unittest::TestIntIntMap>
              ((TestIntIntMap *)
               &(pMVar2->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.table_,
               (this->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.arena_);
    proto2_unittest::TestIntIntMap::operator=
              ((TestIntIntMap *)
               &(pMVar2->super_KeyMapBase<unsigned_long>).super_UntypedMapBase.table_,from);
    *(Map<unsigned_long,_proto2_unittest::TestIntIntMap> **)
     &(pMVar2->super_KeyMapBase<unsigned_long>).super_UntypedMapBase = __range3;
    const_iterator::operator++((const_iterator *)&__end0.super_UntypedMapIterator.bucket_index_);
    __range3 = pMVar2;
  }
  return (Node *)__range3;
}

Assistant:

PROTOBUF_NOINLINE Node* CloneFromOther(const Map& other) {
    Node* head = nullptr;
    for (const auto& [key, value] : other) {
      Node* new_node;
      if constexpr (std::is_base_of_v<MessageLite, mapped_type>) {
        new_node = CreateNode(key);
        new_node->kv.second = value;
      } else {
        new_node = CreateNode(key, value);
      }
      new_node->next = head;
      head = new_node;
    }
    return head;
  }